

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

ExactFloat __thiscall
util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
          (BasicVector<Vector3,_ExactFloat,_3UL> *this,int b)

{
  uint in_EDX;
  BigNum extraout_RDX;
  undefined4 in_register_00000034;
  ExactFloat EVar1;
  S2LogMessage SStack_18;
  
  if ((int)in_EDX < 0) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/vector.h"
               ,0x59,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (b) >= (0) ",0x19);
  }
  else {
    if (in_EDX < 3) {
      ExactFloat::ExactFloat
                ((ExactFloat *)this,
                 (ExactFloat *)(CONCAT44(in_register_00000034,b) + (ulong)in_EDX * 0x10));
      EVar1.bn_.bn_ = extraout_RDX.bn_;
      EVar1._0_8_ = this;
      return EVar1;
    }
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/vector.h"
               ,0x5a,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (b) < (SIZE) ",0x1b);
  }
  abort();
}

Assistant:

T operator[](int b) const {
    S2_DCHECK_GE(b, 0);
    S2_DCHECK_LT(b, SIZE);
    return static_cast<const D&>(*this).Data()[b];
  }